

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O2

string * __thiscall
KMeans::genModelEvaluationFunction_abi_cxx11_(string *__return_storage_ptr__,KMeans *this)

{
  var_bitset *this_00;
  Attribute *pAVar1;
  size_t sVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  string *psVar5;
  string local_e48;
  string numCategVar;
  string evalFunction;
  string precompMeanSum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  string distance;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  string local_d48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  string local_d08;
  string local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  string local_ca8;
  string valueToMeanMap;
  string loadFunction;
  string testTuple;
  string local_c18;
  string local_bf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  string *local_ab8;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  string attrConstruct;
  string attributeString;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&attributeString,"",(allocator *)&attrConstruct);
  Application::offset_abi_cxx11_(&testTuple,&this->super_Application,4);
  local_ab8 = __return_storage_ptr__;
  std::operator+(&attrConstruct,&testTuple,"qi::phrase_parse(tuple.begin(),tuple.end(),");
  std::__cxx11::string::~string((string *)&testTuple);
  for (uVar4 = 0; uVar4 < this->numberOfOriginalVariables; uVar4 = uVar4 + 1) {
    pAVar1 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar4);
    Application::offset_abi_cxx11_(&evalFunction,&this->super_Application,5);
    std::operator+(&precompMeanSum,"\n",&evalFunction);
    std::operator+(&numCategVar,&precompMeanSum,"qi::");
    Application::typeToStr_abi_cxx11_(&local_e48,&this->super_Application,pAVar1->_type);
    std::operator+(&valueToMeanMap,&numCategVar,&local_e48);
    std::operator+(&distance,&valueToMeanMap,"_[phoenix::ref(");
    std::operator+(&loadFunction,&distance,&pAVar1->_name);
    std::operator+(&testTuple,&loadFunction,") = qi::_1]>>");
    std::__cxx11::string::append((string *)&attrConstruct);
    std::__cxx11::string::~string((string *)&testTuple);
    std::__cxx11::string::~string((string *)&loadFunction);
    std::__cxx11::string::~string((string *)&distance);
    std::__cxx11::string::~string((string *)&valueToMeanMap);
    std::__cxx11::string::~string((string *)&local_e48);
    std::__cxx11::string::~string((string *)&numCategVar);
    std::__cxx11::string::~string((string *)&precompMeanSum);
    std::__cxx11::string::~string((string *)&evalFunction);
    Application::offset_abi_cxx11_(&numCategVar,&this->super_Application,2);
    Application::typeToStr_abi_cxx11_(&precompMeanSum,&this->super_Application,pAVar1->_type);
    std::operator+(&valueToMeanMap,&numCategVar,&precompMeanSum);
    std::operator+(&distance,&valueToMeanMap," ");
    std::operator+(&loadFunction,&distance,&pAVar1->_name);
    std::operator+(&testTuple,&loadFunction,";\n");
    std::__cxx11::string::append((string *)&attributeString);
    std::__cxx11::string::~string((string *)&testTuple);
    std::__cxx11::string::~string((string *)&loadFunction);
    std::__cxx11::string::~string((string *)&distance);
    std::__cxx11::string::~string((string *)&valueToMeanMap);
    std::__cxx11::string::~string((string *)&precompMeanSum);
    std::__cxx11::string::~string((string *)&numCategVar);
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  Application::offset_abi_cxx11_(&distance,&this->super_Application,5);
  std::operator+(&loadFunction,",\n",&distance);
  std::operator+(&testTuple,&loadFunction,"\'|\');\n");
  std::__cxx11::string::append((string *)&attrConstruct);
  std::__cxx11::string::~string((string *)&testTuple);
  std::__cxx11::string::~string((string *)&loadFunction);
  std::__cxx11::string::~string((string *)&distance);
  Application::offset_abi_cxx11_(&local_ce8,&this->super_Application,1);
  std::operator+(&local_cc8,&local_ce8,"struct Test_tuple\n");
  Application::offset_abi_cxx11_(&local_ca8,&this->super_Application,1);
  std::operator+(&local_d68,&local_cc8,&local_ca8);
  std::operator+(&local_d28,&local_d68,"{\n");
  std::operator+(&local_d88,&local_d28,&attributeString);
  Application::offset_abi_cxx11_(&local_d08,&this->super_Application,2);
  std::operator+(&local_dc8,&local_d88,&local_d08);
  std::operator+(&local_e48,&local_dc8,"Test_tuple(const std::string& tuple)\n");
  Application::offset_abi_cxx11_(&local_d48,&this->super_Application,2);
  std::operator+(&evalFunction,&local_e48,&local_d48);
  std::operator+(&precompMeanSum,&evalFunction,"{\n");
  std::operator+(&numCategVar,&precompMeanSum,&attrConstruct);
  Application::offset_abi_cxx11_(&local_bf8,&this->super_Application,2);
  std::operator+(&valueToMeanMap,&numCategVar,&local_bf8);
  std::operator+(&distance,&valueToMeanMap,"}\n");
  Application::offset_abi_cxx11_(&local_c18,&this->super_Application,1);
  std::operator+(&loadFunction,&distance,&local_c18);
  std::operator+(&testTuple,&loadFunction,"};\n\n");
  std::__cxx11::string::~string((string *)&loadFunction);
  std::__cxx11::string::~string((string *)&local_c18);
  std::__cxx11::string::~string((string *)&distance);
  std::__cxx11::string::~string((string *)&valueToMeanMap);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::__cxx11::string::~string((string *)&numCategVar);
  std::__cxx11::string::~string((string *)&precompMeanSum);
  std::__cxx11::string::~string((string *)&evalFunction);
  std::__cxx11::string::~string((string *)&local_d48);
  std::__cxx11::string::~string((string *)&local_e48);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string((string *)&local_d88);
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string((string *)&local_d68);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::__cxx11::string::~string((string *)&local_ce8);
  Application::offset_abi_cxx11_(&local_910,&this->super_Application,1);
  std::operator+(&local_8f0,&local_910,"void loadTestDataset(");
  std::operator+(&local_bb8,&local_8f0,"std::vector<Test_tuple>& TestDataset)\n");
  Application::offset_abi_cxx11_(&local_930,&this->super_Application,1);
  std::operator+(&local_b98,&local_bb8,&local_930);
  std::operator+(&local_b78,&local_b98,"{\n");
  Application::offset_abi_cxx11_(&local_950,&this->super_Application,2);
  std::operator+(&local_b58,&local_b78,&local_950);
  std::operator+(&local_b38,&local_b58,"std::ifstream input;\n");
  Application::offset_abi_cxx11_(&local_970,&this->super_Application,2);
  std::operator+(&local_bd8,&local_b38,&local_970);
  std::operator+(&local_b18,&local_bd8,"std::string line;\n");
  Application::offset_abi_cxx11_(&local_990,&this->super_Application,2);
  std::operator+(&local_af8,&local_b18,&local_990);
  std::operator+(&local_ad8,&local_af8,"input.open(PATH_TO_DATA + \"/joinresult.tbl\");\n");
  Application::offset_abi_cxx11_(&local_9b0,&this->super_Application,2);
  std::operator+(&local_c18,&local_ad8,&local_9b0);
  std::operator+(&local_bf8,&local_c18,"if (!input)\n");
  Application::offset_abi_cxx11_(&local_9d0,&this->super_Application,2);
  std::operator+(&local_d48,&local_bf8,&local_9d0);
  std::operator+(&local_d08,&local_d48,"{\n");
  Application::offset_abi_cxx11_(&local_9f0,&this->super_Application,3);
  std::operator+(&local_ca8,&local_d08,&local_9f0);
  std::operator+(&local_ce8,&local_ca8,"std::cerr << \"joinresult.tbl does is not exist.\\n\";\n");
  Application::offset_abi_cxx11_(&local_a10,&this->super_Application,3);
  std::operator+(&local_cc8,&local_ce8,&local_a10);
  std::operator+(&local_d68,&local_cc8,"exit(1);\n");
  Application::offset_abi_cxx11_(&local_a30,&this->super_Application,2);
  std::operator+(&local_d28,&local_d68,&local_a30);
  std::operator+(&local_d88,&local_d28,"}\n");
  Application::offset_abi_cxx11_(&local_a50,&this->super_Application,2);
  std::operator+(&local_dc8,&local_d88,&local_a50);
  std::operator+(&local_e48,&local_dc8,"while(getline(input, line))\n");
  Application::offset_abi_cxx11_(&local_a70,&this->super_Application,3);
  std::operator+(&evalFunction,&local_e48,&local_a70);
  std::operator+(&precompMeanSum,&evalFunction,"TestDataset.push_back(Test_tuple(line));\n");
  Application::offset_abi_cxx11_(&local_a90,&this->super_Application,2);
  std::operator+(&numCategVar,&precompMeanSum,&local_a90);
  std::operator+(&valueToMeanMap,&numCategVar,"input.close();\n");
  Application::offset_abi_cxx11_(&local_ab0,&this->super_Application,1);
  std::operator+(&distance,&valueToMeanMap,&local_ab0);
  std::operator+(&loadFunction,&distance,"}\n\n");
  std::__cxx11::string::~string((string *)&distance);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::__cxx11::string::~string((string *)&valueToMeanMap);
  std::__cxx11::string::~string((string *)&numCategVar);
  std::__cxx11::string::~string((string *)&local_a90);
  std::__cxx11::string::~string((string *)&precompMeanSum);
  std::__cxx11::string::~string((string *)&evalFunction);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::~string((string *)&local_e48);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::__cxx11::string::~string((string *)&local_a50);
  std::__cxx11::string::~string((string *)&local_d88);
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string((string *)&local_a30);
  std::__cxx11::string::~string((string *)&local_d68);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::__cxx11::string::~string((string *)&local_a10);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string((string *)&local_d48);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::__cxx11::string::~string((string *)&local_c18);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::__cxx11::string::~string((string *)&local_af8);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_b18);
  std::__cxx11::string::~string((string *)&local_bd8);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::~string((string *)&local_b58);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b98);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_bb8);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::string((string *)&distance,"",(allocator *)&valueToMeanMap);
  std::__cxx11::string::string((string *)&valueToMeanMap,"",(allocator *)&numCategVar);
  this_00 = &(this->super_Application)._isCategoricalFeature;
  for (uVar4 = 0; uVar4 != 100; uVar4 = uVar4 + 1) {
    if (((this->super_Application)._features.super__Base_bitset<2UL>._M_w[uVar4 >> 6] >>
         (uVar4 & 0x3f) & 1) != 0) {
      pAVar1 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          uVar4);
      psVar5 = &pAVar1->_name;
      if (((this_00->super__Base_bitset<2UL>)._M_w[uVar4 >> 6] & 1L << ((byte)uVar4 & 0x3f)) == 0) {
        std::operator+(&local_cc8,"+((tuple.",psVar5);
        std::operator+(&local_d68,&local_cc8,"-means[cluster].cluster_");
        std::operator+(&local_d28,&local_d68,psVar5);
        std::operator+(&local_d88,&local_d28,")");
        std::operator+(&local_dc8,&local_d88,"*(tuple.");
        std::operator+(&local_e48,&local_dc8,psVar5);
        std::operator+(&evalFunction,&local_e48,"-means[cluster].cluster_");
        std::operator+(&precompMeanSum,&evalFunction,psVar5);
        std::operator+(&numCategVar,&precompMeanSum,"))");
        std::__cxx11::string::append((string *)&distance);
        std::__cxx11::string::~string((string *)&numCategVar);
        std::__cxx11::string::~string((string *)&precompMeanSum);
        std::__cxx11::string::~string((string *)&evalFunction);
        std::__cxx11::string::~string((string *)&local_e48);
        std::__cxx11::string::~string((string *)&local_dc8);
        std::__cxx11::string::~string((string *)&local_d88);
        std::__cxx11::string::~string((string *)&local_d28);
        std::__cxx11::string::~string((string *)&local_d68);
        psVar5 = &local_cc8;
      }
      else {
        std::__cxx11::to_string
                  (&precompMeanSum,
                   **(unsigned_long **)
                     &((*(this->varToQuery[uVar4]->_aggregates).
                         super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                         super__Vector_impl_data._M_start)->_incoming).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  );
        std::operator+(&numCategVar,"V",&precompMeanSum);
        std::__cxx11::string::~string((string *)&precompMeanSum);
        std::operator+(&local_d28,"-2*means[cluster].cluster_",psVar5);
        std::operator+(&local_d88,&local_d28,"[");
        std::operator+(&local_dc8,&local_d88,psVar5);
        std::operator+(&local_e48,&local_dc8,"_clusterIndex[tuple.");
        std::operator+(&evalFunction,&local_e48,psVar5);
        std::operator+(&precompMeanSum,&evalFunction,"]]");
        std::__cxx11::string::append((string *)&distance);
        std::__cxx11::string::~string((string *)&precompMeanSum);
        std::__cxx11::string::~string((string *)&evalFunction);
        std::__cxx11::string::~string((string *)&local_e48);
        std::__cxx11::string::~string((string *)&local_dc8);
        std::__cxx11::string::~string((string *)&local_d88);
        std::__cxx11::string::~string((string *)&local_d28);
        Application::offset_abi_cxx11_(&local_b58,&this->super_Application,2);
        std::operator+(&local_b38,"\n",&local_b58);
        std::operator+(&local_bd8,&local_b38,"std::unordered_map<");
        Application::typeToStr_abi_cxx11_(&local_b78,&this->super_Application,pAVar1->_type);
        std::operator+(&local_b18,&local_bd8,&local_b78);
        std::operator+(&local_af8,&local_b18,", size_t> ");
        std::operator+(&local_ad8,&local_af8,psVar5);
        std::operator+(&local_c18,&local_ad8,"_clusterIndex(");
        std::operator+(&local_bf8,&local_c18,&numCategVar);
        std::operator+(&local_d48,&local_bf8,".size());\n");
        Application::offset_abi_cxx11_(&local_b98,&this->super_Application,2);
        std::operator+(&local_d08,&local_d48,&local_b98);
        std::operator+(&local_ca8,&local_d08,"for (size_t l=0; l<");
        std::operator+(&local_ce8,&local_ca8,&numCategVar);
        std::operator+(&local_cc8,&local_ce8,".size(); ++l)\n");
        Application::offset_abi_cxx11_(&local_bb8,&this->super_Application,3);
        std::operator+(&local_d68,&local_cc8,&local_bb8);
        std::operator+(&local_d28,&local_d68,psVar5);
        std::operator+(&local_d88,&local_d28,"_clusterIndex[");
        std::operator+(&local_dc8,&local_d88,&numCategVar);
        std::operator+(&local_e48,&local_dc8,"[l].");
        std::operator+(&evalFunction,&local_e48,psVar5);
        std::operator+(&precompMeanSum,&evalFunction,"] = l;\n");
        std::__cxx11::string::append((string *)&valueToMeanMap);
        std::__cxx11::string::~string((string *)&precompMeanSum);
        std::__cxx11::string::~string((string *)&evalFunction);
        std::__cxx11::string::~string((string *)&local_e48);
        std::__cxx11::string::~string((string *)&local_dc8);
        std::__cxx11::string::~string((string *)&local_d88);
        std::__cxx11::string::~string((string *)&local_d28);
        std::__cxx11::string::~string((string *)&local_d68);
        std::__cxx11::string::~string((string *)&local_bb8);
        std::__cxx11::string::~string((string *)&local_cc8);
        std::__cxx11::string::~string((string *)&local_ce8);
        std::__cxx11::string::~string((string *)&local_ca8);
        std::__cxx11::string::~string((string *)&local_d08);
        std::__cxx11::string::~string((string *)&local_b98);
        std::__cxx11::string::~string((string *)&local_d48);
        std::__cxx11::string::~string((string *)&local_bf8);
        std::__cxx11::string::~string((string *)&local_c18);
        std::__cxx11::string::~string((string *)&local_ad8);
        std::__cxx11::string::~string((string *)&local_af8);
        std::__cxx11::string::~string((string *)&local_b18);
        std::__cxx11::string::~string((string *)&local_b78);
        std::__cxx11::string::~string((string *)&local_bd8);
        std::__cxx11::string::~string((string *)&local_b38);
        std::__cxx11::string::~string((string *)&local_b58);
        psVar5 = &numCategVar;
      }
      std::__cxx11::string::~string((string *)psVar5);
    }
  }
  sVar2 = std::_Base_bitset<2UL>::_M_do_count(&this_00->super__Base_bitset<2UL>);
  std::__cxx11::to_string(&numCategVar,sVar2 >> 1);
  std::__cxx11::string::string((string *)&precompMeanSum,"",(allocator *)&evalFunction);
  local_d48._M_dataplus._M_p = (pointer)0x0;
  while( true ) {
    if ((pointer)0x63 < local_d48._M_dataplus._M_p) break;
    if ((((this->clusterVariables).super__Base_bitset<2UL>._M_w
          [(ulong)local_d48._M_dataplus._M_p >> 6] >> ((ulong)local_d48._M_dataplus._M_p & 0x3f) & 1
         ) != 0) &&
       (((this_00->super__Base_bitset<2UL>)._M_w[(ulong)local_d48._M_dataplus._M_p >> 6] &
        1L << ((byte)local_d48._M_dataplus._M_p & 0x3f)) != 0)) {
      pmVar3 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&clusterToVariableMap,(key_type *)&local_d48);
      std::__cxx11::to_string
                (&local_e48,
                 **(unsigned_long **)
                   &((*(this->varToQuery[*pmVar3]->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start)->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                );
      std::operator+(&evalFunction,"V",&local_e48);
      std::__cxx11::string::~string((string *)&local_e48);
      pAVar1 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          (size_t)local_d48._M_dataplus._M_p);
      Application::offset_abi_cxx11_(&local_ca8,&this->super_Application,3);
      std::operator+(&local_ce8,&local_ca8,"for (size_t i = 0; i < ");
      std::operator+(&local_cc8,&local_ce8,&evalFunction);
      std::operator+(&local_d68,&local_cc8,".size(); ++i)\n");
      Application::offset_abi_cxx11_(&local_d08,&this->super_Application,4);
      std::operator+(&local_d28,&local_d68,&local_d08);
      std::operator+(&local_d88,&local_d28,"sum_mean_squared[cluster] += std::pow(mean_tuple.");
      std::operator+(&local_dc8,&local_d88,&pAVar1->_name);
      std::operator+(&local_e48,&local_dc8,"[i],2);\n\n");
      std::__cxx11::string::append((string *)&precompMeanSum);
      std::__cxx11::string::~string((string *)&local_e48);
      std::__cxx11::string::~string((string *)&local_dc8);
      std::__cxx11::string::~string((string *)&local_d88);
      std::__cxx11::string::~string((string *)&local_d28);
      std::__cxx11::string::~string((string *)&local_d08);
      std::__cxx11::string::~string((string *)&local_d68);
      std::__cxx11::string::~string((string *)&local_cc8);
      std::__cxx11::string::~string((string *)&local_ce8);
      std::__cxx11::string::~string((string *)&local_ca8);
      std::__cxx11::string::~string((string *)&evalFunction);
    }
    local_d48._M_dataplus._M_p = local_d48._M_dataplus._M_p + 1;
  }
  Application::offset_abi_cxx11_(&local_4b0,&this->super_Application,1);
  std::operator+(&local_490,&local_4b0,"void evaluateModel(Cluster_mean* means)\n");
  psVar5 = local_ab8;
  Application::offset_abi_cxx11_(&local_4d0,&this->super_Application,1);
  std::operator+(&local_470,&local_490,&local_4d0);
  std::operator+(&local_450,&local_470,"{\n");
  Application::offset_abi_cxx11_(&local_4f0,&this->super_Application,2);
  std::operator+(&local_430,&local_450,&local_4f0);
  std::operator+(&local_410,&local_430,"std::vector<Test_tuple> TestDataset;\n");
  Application::offset_abi_cxx11_(&local_510,&this->super_Application,2);
  std::operator+(&local_3f0,&local_410,&local_510);
  std::operator+(&local_3d0,&local_3f0,"loadTestDataset(TestDataset);\n");
  Application::offset_abi_cxx11_(&local_530,&this->super_Application,2);
  std::operator+(&local_3b0,&local_3d0,&local_530);
  std::operator+(&local_390,&local_3b0,"size_t idx = 0;\n");
  std::operator+(&local_370,&local_390,&valueToMeanMap);
  std::operator+(&local_350,&local_370,"\n");
  Application::offset_abi_cxx11_(&local_550,&this->super_Application,2);
  std::operator+(&local_330,&local_350,&local_550);
  std::operator+(&local_310,&local_330,"double sum_mean_squared[k] = {};\n");
  Application::offset_abi_cxx11_(&local_570,&this->super_Application,2);
  std::operator+(&local_2f0,&local_310,&local_570);
  std::operator+(&local_2d0,&local_2f0,"for (size_t cluster = 0; cluster < k; ++cluster)\n");
  Application::offset_abi_cxx11_(&local_590,&this->super_Application,2);
  std::operator+(&local_2b0,&local_2d0,&local_590);
  std::operator+(&local_290,&local_2b0,"{\n");
  Application::offset_abi_cxx11_(&local_5b0,&this->super_Application,3);
  std::operator+(&local_270,&local_290,&local_5b0);
  std::operator+(&local_250,&local_270,"Cluster_mean& mean_tuple = means[cluster];\n");
  std::operator+(&local_230,&local_250,&precompMeanSum);
  Application::offset_abi_cxx11_(&local_5d0,&this->super_Application,2);
  std::operator+(&local_210,&local_230,&local_5d0);
  std::operator+(&local_1f0,&local_210,"}\n");
  Application::offset_abi_cxx11_(&local_5f0,&this->super_Application,2);
  std::operator+(&local_1d0,&local_1f0,&local_5f0);
  std::operator+(&local_1b0,&local_1d0,"double distance, error = 0.0, ");
  std::operator+(&local_190,&local_1b0,"min_distance;\n");
  Application::offset_abi_cxx11_(&local_610,&this->super_Application,2);
  std::operator+(&local_170,&local_190,&local_610);
  std::operator+(&local_150,&local_170,"std::vector<size_t> assignments(TestDataset.size());\n");
  Application::offset_abi_cxx11_(&local_630,&this->super_Application,2);
  std::operator+(&local_130,&local_150,&local_630);
  std::operator+(&local_110,&local_130,"for (size_t tup = 0; tup < TestDataset.size(); ++tup){\n");
  Application::offset_abi_cxx11_(&local_650,&this->super_Application,3);
  std::operator+(&local_f0,&local_110,&local_650);
  std::operator+(&local_d0,&local_f0,"const Test_tuple &tuple = TestDataset[tup];\n");
  Application::offset_abi_cxx11_(&local_670,&this->super_Application,3);
  std::operator+(&local_b0,&local_d0,&local_670);
  std::operator+(&local_90,&local_b0,"min_distance = std::numeric_limits<double>::max();\n");
  Application::offset_abi_cxx11_(&local_690,&this->super_Application,3);
  std::operator+(&local_70,&local_90,&local_690);
  std::operator+(&local_50,&local_70,"for (size_t cluster = 0; cluster < k; ++cluster)\n");
  Application::offset_abi_cxx11_(&local_6b0,&this->super_Application,3);
  std::operator+(&local_ab0,&local_50,&local_6b0);
  std::operator+(&local_a90,&local_ab0,"{\n");
  Application::offset_abi_cxx11_(&local_6d0,&this->super_Application,4);
  std::operator+(&local_a70,&local_a90,&local_6d0);
  std::operator+(&local_a50,&local_a70,"distance = ");
  std::operator+(&local_a30,&local_a50,&numCategVar);
  std::operator+(&local_a10,&local_a30,"+sum_mean_squared[cluster]");
  std::operator+(&local_9f0,&local_a10,&distance);
  std::operator+(&local_9d0,&local_9f0,";\n");
  Application::offset_abi_cxx11_(&local_6f0,&this->super_Application,4);
  std::operator+(&local_9b0,&local_9d0,&local_6f0);
  std::operator+(&local_990,&local_9b0,"if(distance < min_distance) assignments[tup] = cluster;\n");
  Application::offset_abi_cxx11_(&local_710,&this->super_Application,4);
  std::operator+(&local_970,&local_990,&local_710);
  std::operator+(&local_950,&local_970,"min_distance = std::min(distance, min_distance);\n");
  Application::offset_abi_cxx11_(&local_730,&this->super_Application,3);
  std::operator+(&local_930,&local_950,&local_730);
  std::operator+(&local_910,&local_930,"}\n");
  Application::offset_abi_cxx11_(&local_750,&this->super_Application,3);
  std::operator+(&local_8f0,&local_910,&local_750);
  std::operator+(&local_bb8,&local_8f0,"error += min_distance;\n");
  Application::offset_abi_cxx11_(&local_770,&this->super_Application,2);
  std::operator+(&local_b98,&local_bb8,&local_770);
  std::operator+(&local_b78,&local_b98,"}\n");
  Application::offset_abi_cxx11_(&local_790,&this->super_Application,2);
  std::operator+(&local_b58,&local_b78,&local_790);
  std::operator+(&local_b38,&local_b58,"std::ofstream ofs(\"times.txt\",std::ofstream::out | ");
  std::operator+(&local_bd8,&local_b38,"std::ofstream::app);\n");
  Application::offset_abi_cxx11_(&local_7b0,&this->super_Application,2);
  std::operator+(&local_b18,&local_bd8,&local_7b0);
  std::operator+(&local_af8,&local_b18,"ofs << \"\\t\" << error;\n");
  Application::offset_abi_cxx11_(&local_7d0,&this->super_Application,2);
  std::operator+(&local_ad8,&local_af8,&local_7d0);
  std::operator+(&local_c18,&local_ad8,"ofs.close();\n\n");
  Application::offset_abi_cxx11_(&local_7f0,&this->super_Application,2);
  std::operator+(&local_bf8,&local_c18,&local_7f0);
  std::operator+(&local_d48,&local_bf8,
                 "std::cout << \"Within Cluster l2-distance: \" << error << std::endl;\n");
  Application::offset_abi_cxx11_(&local_810,&this->super_Application,2);
  std::operator+(&local_d08,&local_d48,&local_810);
  std::operator+(&local_ca8,&local_d08,"ofs.open(\"assignments.csv\");\n");
  Application::offset_abi_cxx11_(&local_830,&this->super_Application,2);
  std::operator+(&local_ce8,&local_ca8,&local_830);
  std::operator+(&local_cc8,&local_ce8,"for (const size_t& a : assignments)\n");
  Application::offset_abi_cxx11_(&local_850,&this->super_Application,3);
  std::operator+(&local_d68,&local_cc8,&local_850);
  std::operator+(&local_d28,&local_d68,"ofs << a << \"\\n\";\n");
  Application::offset_abi_cxx11_(&local_870,&this->super_Application,2);
  std::operator+(&local_d88,&local_d28,&local_870);
  std::operator+(&local_dc8,&local_d88,"ofs.close();\n");
  Application::offset_abi_cxx11_(&local_890,&this->super_Application,1);
  std::operator+(&local_e48,&local_dc8,&local_890);
  std::operator+(&evalFunction,&local_e48,"}\n");
  std::__cxx11::string::~string((string *)&local_e48);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::__cxx11::string::~string((string *)&local_d88);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string((string *)&local_d68);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::__cxx11::string::~string((string *)&local_830);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::~string((string *)&local_d48);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::~string((string *)&local_c18);
  std::__cxx11::string::~string((string *)&local_ad8);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_af8);
  std::__cxx11::string::~string((string *)&local_b18);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::~string((string *)&local_bd8);
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::~string((string *)&local_b58);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b98);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&local_bb8);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_a10);
  std::__cxx11::string::~string((string *)&local_a30);
  std::__cxx11::string::~string((string *)&local_a50);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_a90);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::operator+(&local_e48,&testTuple,&loadFunction);
  std::operator+(psVar5,&local_e48,&evalFunction);
  std::__cxx11::string::~string((string *)&local_e48);
  std::__cxx11::string::~string((string *)&evalFunction);
  std::__cxx11::string::~string((string *)&precompMeanSum);
  std::__cxx11::string::~string((string *)&numCategVar);
  std::__cxx11::string::~string((string *)&valueToMeanMap);
  std::__cxx11::string::~string((string *)&distance);
  std::__cxx11::string::~string((string *)&loadFunction);
  std::__cxx11::string::~string((string *)&testTuple);
  std::__cxx11::string::~string((string *)&attrConstruct);
  std::__cxx11::string::~string((string *)&attributeString);
  return psVar5;
}

Assistant:

std::string KMeans::genModelEvaluationFunction()
{
    std::string attributeString = "",
        attrConstruct = offset(4)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
    
    for (size_t var = 0; var < numberOfOriginalVariables; ++var)
    {
        Attribute* att = _td->getAttribute(var);
        attrConstruct += "\n"+offset(5)+"qi::"+typeToStr(att->_type)+
            "_[phoenix::ref("+att->_name+") = qi::_1]>>";
        attributeString += offset(2)+typeToStr(att->_type) + " "+
            att->_name + ";\n";
    }

    // attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct += ",\n"+offset(5)+"\'|\');\n";

    std::string testTuple = offset(1)+"struct Test_tuple\n"+offset(1)+"{\n"+
        attributeString+offset(2)+"Test_tuple(const std::string& tuple)\n"+
        offset(2)+"{\n"+attrConstruct+offset(2)+"}\n"+offset(1)+"};\n\n";

    std::string loadFunction = offset(1)+"void loadTestDataset("+
        "std::vector<Test_tuple>& TestDataset)\n"+offset(1)+"{\n"+
        offset(2)+"std::ifstream input;\n"+offset(2)+"std::string line;\n"+
        offset(2)+"input.open(PATH_TO_DATA + \"/joinresult.tbl\");\n"+
        offset(2)+"if (!input)\n"+offset(2)+"{\n"+
        offset(3)+"std::cerr << \"joinresult.tbl does is not exist.\\n\";\n"+
        offset(3)+"exit(1);\n"+offset(2)+"}\n"+
        offset(2)+"while(getline(input, line))\n"+
        offset(3)+"TestDataset.push_back(Test_tuple(line));\n"+
        offset(2)+"input.close();\n"+offset(1)+"}\n\n";

    size_t categVarIdx = 0;
    std::string distance = "", valueToMeanMap = "";
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features[var])
            continue;

        Attribute* att = _td->getAttribute(var);
        std::string& varName = att->_name;
        
        if (_isCategoricalFeature[var])
        {
            const std::string& viewName = "V"+std::to_string(
                varToQuery[var]->_aggregates[0]->_incoming[0].first);
            
            distance += "-2*means[cluster].cluster_"+varName+"["+
                varName+"_clusterIndex[tuple."+varName+"]]";

            valueToMeanMap += "\n"+offset(2)+"std::unordered_map<"+
                typeToStr(att->_type)+", size_t> "+
                varName+"_clusterIndex("+viewName+".size());\n"+
                offset(2)+"for (size_t l=0; l<"+viewName+".size(); ++l)\n"+
                offset(3)+varName+"_clusterIndex["+viewName+"[l]."+varName+"] = l;\n";

            ++categVarIdx;
        }
        else
            distance += "+((tuple."+att->_name+"-means[cluster].cluster_"+att->_name+")"+
                "*(tuple."+att->_name+"-means[cluster].cluster_"+att->_name+"))";
    }
    
    std::string numCategVar = std::to_string(_isCategoricalFeature.count()/2); 

    std::string precompMeanSum = "";
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!clusterVariables[var] || !_isCategoricalFeature[var])
            continue;

        size_t origVar = clusterToVariableMap[var];
        const std::string& origView = "V"+std::to_string(
            varToQuery[origVar]->_aggregates[0]->_incoming[0].first);

        const std::string& attName = _td->getAttribute(var)->_name;

        // precompMeanSum += offset(2)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        //     Offset(2)+"{\N"+offset(3)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
        //     offset(4)+"sum_mean_squared[idx] += std::pow(means[cluster]."
        //     +attName+"[i],2);\n"+offset(3)+"++idx;\n"+offset(2)+"}\n\n";
        
        precompMeanSum += offset(3)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
            offset(4)+"sum_mean_squared[cluster] += std::pow(mean_tuple."
            +attName+"[i],2);\n\n";
    }
    
    std::string evalFunction = offset(1)+"void evaluateModel(Cluster_mean* means)\n"+
        offset(1)+"{\n"+
        offset(2)+"std::vector<Test_tuple> TestDataset;\n"+
        offset(2)+"loadTestDataset(TestDataset);\n"+
        offset(2)+"size_t idx = 0;\n"+valueToMeanMap+"\n"+
        offset(2)+"double sum_mean_squared[k] = {};\n"+
        offset(2)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        offset(2)+"{\n"+offset(3)+"Cluster_mean& mean_tuple = means[cluster];\n"+
        precompMeanSum+offset(2)+"}\n"+
        offset(2)+"double distance, error = 0.0, "+
        "min_distance;\n"+
        offset(2)+"std::vector<size_t> assignments(TestDataset.size());\n"+
        // offset(2)+"#pragma omp parallel for num_threads(32) private(min_distance,distance) reduction(+:error)\n"+
        offset(2)+"for (size_t tup = 0; tup < TestDataset.size(); ++tup){\n"+
        offset(3)+"const Test_tuple &tuple = TestDataset[tup];\n"+
        // offset(2)+"for (Test_tuple& tuple : TestDataset)\n"+offset(2)+"{\n"+
        offset(3)+"min_distance = std::numeric_limits<double>::max();\n"+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(3)+"{\n"+
        offset(4)+"distance = "+numCategVar+"+sum_mean_squared[cluster]"+distance+";\n"+
        offset(4)+"if(distance < min_distance) assignments[tup] = cluster;\n"+
        offset(4)+"min_distance = std::min(distance, min_distance);\n"+
        offset(3)+"}\n"+offset(3)+"error += min_distance;\n"+
        offset(2)+"}\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | "+
        "std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << error;\n"+
        offset(2)+"ofs.close();\n\n"+
        offset(2)+
        "std::cout << \"Within Cluster l2-distance: \" << error << std::endl;\n"+
        offset(2)+"ofs.open(\"assignments.csv\");\n"+
        offset(2)+"for (const size_t& a : assignments)\n"+
        offset(3)+"ofs << a << \"\\n\";\n"+
        offset(2)+"ofs.close();\n"+
        offset(1)+"}\n";

    return testTuple + loadFunction + evalFunction;
}